

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O1

void Sbd_ManCutExpand(Gia_Man_t *p,Vec_Int_t *vMirrors,Vec_Int_t *vLutLevs,Vec_Int_t *vCut)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  int *piVar8;
  uint Entry;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  bool bVar15;
  
  piVar1 = &vCut->nSize;
LAB_00543536:
  uVar2 = vCut->nSize;
  uVar9 = (ulong)(int)uVar2;
  uVar10 = 0;
  if (0 < (long)uVar9) {
    piVar7 = vCut->pArray;
    uVar10 = 0;
LAB_00543552:
    iVar3 = piVar7[uVar10];
    lVar11 = (long)iVar3;
    if ((lVar11 < 0) || (iVar4 = vLutLevs->nSize, iVar4 <= iVar3)) {
LAB_0054374b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if (p->nObjs <= iVar3) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar12 = (uint)*(undefined8 *)(p->pObjs + lVar11);
    if ((~uVar12 & 0x9fffffff) == 0) goto LAB_005436bc;
    if (((int)uVar12 < 0) || ((uVar12 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                    ,0xb2,
                    "int Sbd_ManCutExpandOne(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int)"
                   );
    }
    uVar12 = iVar3 - (uVar12 & 0x1fffffff);
    if (((((int)uVar12 < 0) || (vMirrors->nSize <= (int)uVar12)) ||
        (uVar14 = iVar3 - ((uint)((ulong)*(undefined8 *)(p->pObjs + lVar11) >> 0x20) & 0x1fffffff),
        (int)uVar14 < 0)) || (vMirrors->nSize <= (int)uVar14)) goto LAB_0054374b;
    piVar8 = vLutLevs->pArray;
    uVar5 = vMirrors->pArray[uVar12];
    uVar6 = vMirrors->pArray[uVar14];
    Entry = uVar5 >> 1;
    if ((int)uVar5 < 0) {
      Entry = uVar12;
    }
    uVar12 = uVar6 >> 1;
    if ((int)uVar6 < 0) {
      uVar12 = uVar14;
    }
    lVar13 = 0;
    do {
      uVar14 = piVar7[lVar13];
      if (uVar14 == Entry) break;
      bVar15 = uVar9 - 1 != lVar13;
      lVar13 = lVar13 + 1;
    } while (bVar15);
    lVar13 = 0;
    do {
      uVar5 = piVar7[lVar13];
      if (uVar5 == uVar12) break;
      bVar15 = uVar9 - 1 != lVar13;
      lVar13 = lVar13 + 1;
    } while (bVar15);
    if ((uVar14 != Entry) && (uVar5 != uVar12)) goto LAB_005436bc;
    if (((int)Entry < 0) || (iVar4 <= (int)Entry)) goto LAB_0054374b;
    if (piVar8[lVar11] < piVar8[Entry]) goto LAB_005436bc;
    if (((int)uVar12 < 0) || (iVar4 <= (int)uVar12)) goto LAB_0054374b;
    if (piVar8[lVar11] < piVar8[uVar12]) goto LAB_005436bc;
    *piVar1 = uVar2 - 1;
    uVar9 = uVar10;
    if ((int)uVar10 < (int)(uVar2 - 1)) {
      do {
        piVar7[uVar9] = piVar7[uVar9 + 1];
        uVar9 = uVar9 + 1;
      } while ((int)uVar9 < *piVar1);
    }
    if ((uVar14 != Entry) && (Entry != 0)) {
      Vec_IntPushOrder(vCut,Entry);
    }
    if ((uVar5 != uVar12) && (uVar12 != 0)) {
      Vec_IntPushOrder(vCut,uVar12);
    }
  }
  goto LAB_005436d4;
LAB_005436bc:
  uVar10 = uVar10 + 1;
  if (uVar10 == uVar9) goto code_r0x005436c8;
  goto LAB_00543552;
code_r0x005436c8:
  uVar10 = (ulong)uVar2;
LAB_005436d4:
  if (*piVar1 <= (int)uVar10) {
    return;
  }
  goto LAB_00543536;
}

Assistant:

void Sbd_ManCutExpand( Gia_Man_t * p, Vec_Int_t * vMirrors, Vec_Int_t * vLutLevs, Vec_Int_t * vCut )
{
    int i, Entry;
    do
    {
        Vec_IntForEachEntry( vCut, Entry, i )
            if ( Sbd_ManCutExpandOne( p, vMirrors, vLutLevs, vCut, i, Entry ) )
                break;
    } 
    while ( i < Vec_IntSize(vCut) );
}